

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O1

void __thiscall
UCAFL::_uc_hook_block(UCAFL *this,uc_engine *uc,uint64_t address,uint32_t size,void *user_data)

{
  char *pcVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  ulong uVar4;
  double in_XMM0_Qa;
  
  lVar3 = CONCAT44(in_register_0000000c,size);
  uVar4 = ((long)uc << 0x20 | (ulong)uc >> 0x20) ^ 0xc73ab174c5ecd5a2;
  uVar4 = ((uVar4 << 0x18 | uVar4 >> 0x28) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ uVar4) *
          -0x604de39ae16720db;
  uVar4 = ((uVar4 >> 0x23) + 8 ^ uVar4) * -0x604de39ae16720db;
  uVar2 = ((uint)(uVar4 >> 0x1c) ^ (uint)uVar4) & 0xffff;
  pcVar1 = (char *)(*(long *)(lVar3 + 0x50) + (*(ulong *)(lVar3 + 0x60) ^ (ulong)uVar2));
  *pcVar1 = *pcVar1 + '\x01';
  *(ulong *)(lVar3 + 0x60) = (ulong)(uVar2 >> 1);
  log(in_XMM0_Qa);
  return;
}

Assistant:

static void _uc_hook_block(uc_engine* uc, uint64_t address, uint32_t size,
                               void* user_data) {
        uint64_t cur_loc = afl_hash_ip(address) & (MAP_SIZE - 1);
        UCAFL* ucafl = (UCAFL*)user_data;

        ucafl->afl_area_ptr_[cur_loc ^ ucafl->afl_prev_loc_]++;
        ucafl->afl_prev_loc_ = cur_loc >> 1;

        ERR_CHILD("uc_hook_block address=0x%" PRIx64 " cur_loc=%" PRIu64
                  " prev_loc=%" PRIu64 "\n",
                  address, cur_loc, ucafl->afl_prev_loc_);
    }